

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedNumberFormat::parse
          (RuleBasedNumberFormat *this,UnicodeString *text,Formattable *result,
          ParsePosition *parsePosition)

{
  NFRuleSet *this_00;
  bool bVar1;
  UBool UVar2;
  int32_t iVar3;
  int32_t iVar4;
  Type TVar5;
  double number;
  double dVar6;
  int local_1f8;
  double d;
  int32_t errorIndex;
  int32_t startIndex;
  Formattable working_result;
  ParsePosition working_pp;
  NFRuleSet *rp;
  NFRuleSet **p;
  Formattable high_result;
  ParsePosition high_pp;
  undefined1 local_78 [8];
  ParsePosition workingPos;
  UnicodeString workingText;
  ParsePosition *parsePosition_local;
  Formattable *result_local;
  UnicodeString *text_local;
  RuleBasedNumberFormat *this_local;
  
  if (this->fRuleSets == (NFRuleSet **)0x0) {
    ParsePosition::setErrorIndex(parsePosition,0);
  }
  else {
    iVar3 = ParsePosition::getIndex(parsePosition);
    UnicodeString::UnicodeString((UnicodeString *)&workingPos.index,text,iVar3);
    ParsePosition::ParsePosition((ParsePosition *)local_78,0);
    ParsePosition::ParsePosition((ParsePosition *)((long)&high_result.fBogus.fUnion + 0x30),0);
    Formattable::Formattable((Formattable *)&p);
    for (rp = (NFRuleSet *)this->fRuleSets; *(long *)rp != 0; rp = (NFRuleSet *)&rp->name) {
      this_00 = *(NFRuleSet **)rp;
      UVar2 = NFRuleSet::isPublic(this_00);
      if ((UVar2 != '\0') && (UVar2 = NFRuleSet::isParseable(this_00), UVar2 != '\0')) {
        ParsePosition::ParsePosition
                  ((ParsePosition *)((long)&working_result.fBogus.fUnion + 0x30),0);
        Formattable::Formattable((Formattable *)&startIndex);
        NFRuleSet::parse(this_00,(UnicodeString *)&workingPos.index,
                         (ParsePosition *)((long)&working_result.fBogus.fUnion + 0x30),
                         17592186044416.0,0,(Formattable *)&startIndex);
        iVar3 = ParsePosition::getIndex
                          ((ParsePosition *)((long)&working_result.fBogus.fUnion + 0x30));
        iVar4 = ParsePosition::getIndex((ParsePosition *)((long)&high_result.fBogus.fUnion + 0x30));
        if (iVar4 < iVar3) {
          ParsePosition::operator=
                    ((ParsePosition *)((long)&high_result.fBogus.fUnion + 0x30),
                     (ParsePosition *)((long)&working_result.fBogus.fUnion + 0x30));
          Formattable::operator=((Formattable *)&p,(Formattable *)&startIndex);
          iVar3 = ParsePosition::getIndex
                            ((ParsePosition *)((long)&high_result.fBogus.fUnion + 0x30));
          iVar4 = UnicodeString::length((UnicodeString *)&workingPos.index);
          if (iVar3 != iVar4) goto LAB_0026f829;
          bVar1 = true;
        }
        else {
LAB_0026f829:
          bVar1 = false;
        }
        Formattable::~Formattable((Formattable *)&startIndex);
        ParsePosition::~ParsePosition((ParsePosition *)((long)&working_result.fBogus.fUnion + 0x30))
        ;
        if (bVar1) break;
      }
    }
    iVar3 = ParsePosition::getIndex(parsePosition);
    iVar4 = ParsePosition::getIndex((ParsePosition *)((long)&high_result.fBogus.fUnion + 0x30));
    ParsePosition::setIndex(parsePosition,iVar3 + iVar4);
    iVar4 = ParsePosition::getIndex((ParsePosition *)((long)&high_result.fBogus.fUnion + 0x30));
    if (iVar4 < 1) {
      iVar4 = ParsePosition::getErrorIndex
                        ((ParsePosition *)((long)&high_result.fBogus.fUnion + 0x30));
      if (iVar4 < 1) {
        local_1f8 = 0;
      }
      else {
        local_1f8 = ParsePosition::getErrorIndex
                              ((ParsePosition *)((long)&high_result.fBogus.fUnion + 0x30));
      }
      ParsePosition::setErrorIndex(parsePosition,iVar3 + local_1f8);
    }
    else {
      ParsePosition::setErrorIndex(parsePosition,-1);
    }
    Formattable::operator=(result,(Formattable *)&p);
    TVar5 = Formattable::getType(result);
    if (TVar5 == kDouble) {
      number = Formattable::getDouble(result);
      UVar2 = uprv_isNaN_63(number);
      if ((((UVar2 == '\0') && (dVar6 = uprv_trunc_63(number), number == dVar6)) &&
          (-2147483648.0 <= number)) && (number <= 2147483647.0)) {
        Formattable::setLong(result,(int)number);
      }
    }
    Formattable::~Formattable((Formattable *)&p);
    ParsePosition::~ParsePosition((ParsePosition *)((long)&high_result.fBogus.fUnion + 0x30));
    ParsePosition::~ParsePosition((ParsePosition *)local_78);
    UnicodeString::~UnicodeString((UnicodeString *)&workingPos.index);
  }
  return;
}

Assistant:

void
RuleBasedNumberFormat::parse(const UnicodeString& text,
                             Formattable& result,
                             ParsePosition& parsePosition) const
{
    if (!fRuleSets) {
        parsePosition.setErrorIndex(0);
        return;
    }

    UnicodeString workingText(text, parsePosition.getIndex());
    ParsePosition workingPos(0);

    ParsePosition high_pp(0);
    Formattable high_result;

    for (NFRuleSet** p = fRuleSets; *p; ++p) {
        NFRuleSet *rp = *p;
        if (rp->isPublic() && rp->isParseable()) {
            ParsePosition working_pp(0);
            Formattable working_result;

            rp->parse(workingText, working_pp, kMaxDouble, 0, working_result);
            if (working_pp.getIndex() > high_pp.getIndex()) {
                high_pp = working_pp;
                high_result = working_result;

                if (high_pp.getIndex() == workingText.length()) {
                    break;
                }
            }
        }
    }

    int32_t startIndex = parsePosition.getIndex();
    parsePosition.setIndex(startIndex + high_pp.getIndex());
    if (high_pp.getIndex() > 0) {
        parsePosition.setErrorIndex(-1);
    } else {
        int32_t errorIndex = (high_pp.getErrorIndex()>0)? high_pp.getErrorIndex(): 0;
        parsePosition.setErrorIndex(startIndex + errorIndex);
    }
    result = high_result;
    if (result.getType() == Formattable::kDouble) {
        double d = result.getDouble();
        if (!uprv_isNaN(d) && d == uprv_trunc(d) && INT32_MIN <= d && d <= INT32_MAX) {
            // Note: casting a double to an int when the double is too large or small
            //       to fit the destination is undefined behavior. The explicit range checks,
            //       above, are required. Just casting and checking the result value is undefined.
            result.setLong(static_cast<int32_t>(d));
        }
    }
}